

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverLifetimesTest_WarningsAndErrors_Test::
~FeatureResolverLifetimesTest_WarningsAndErrors_Test
          (FeatureResolverLifetimesTest_WarningsAndErrors_Test *this)

{
  FeatureResolverLifetimesTest_WarningsAndErrors_Test *this_local;
  
  ~FeatureResolverLifetimesTest_WarningsAndErrors_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FeatureResolverLifetimesTest, WarningsAndErrors) {
  FeatureSet features = ParseTextOrDie(R"pb(
    [pb.test] { future_feature: VALUE1 removed_feature: VALUE1 }
  )pb");
  auto results = FeatureResolver::ValidateFeatureLifetimes(EDITION_2023,
                                                           features, nullptr);
  EXPECT_THAT(results.errors,
              ElementsAre(HasSubstr("pb.TestFeatures.future_feature")));
  EXPECT_THAT(results.warnings,
              ElementsAre(HasSubstr("pb.TestFeatures.removed_feature")));
}